

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::parseProperty(Moc *this,ClassDef *def,PropertyMode mode)

{
  long in_FS_OFFSET;
  PropertyDef local_180;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(&this->super_Parser,LPAREN);
  local_180.constant = true;
  local_180.final = true;
  local_180.required = true;
  local_180._331_1_ = 0xaa;
  local_180.relativeIndex = -0x55555556;
  memset(&local_180,0,0x138);
  local_180.notifyId = -1;
  local_180._316_7_ = 0;
  local_180.revision._3_1_ = 0;
  local_180.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
       (QFlagsStorageHelper<TypeTag,_4>)(QFlagsStorage<TypeTag>)0x0;
  local_180._328_4_ = local_180._328_4_ & 0xff000000;
  local_180.relativeIndex = -1;
  local_180.location = -1;
  createPropertyDef(this,&local_180,(int)(def->propertyList).d.size,mode);
  Parser::next(&this->super_Parser,PP_RPAREN);
  QList<PropertyDef>::emplaceBack<PropertyDef_const&>(&def->propertyList,&local_180);
  PropertyDef::~PropertyDef(&local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parseProperty(ClassDef *def, Moc::PropertyMode mode)
{
    next(LPAREN);
    PropertyDef propDef;
    createPropertyDef(propDef, int(def->propertyList.size()), mode);
    next(RPAREN);

    def->propertyList += propDef;
}